

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O0

void relink_light_sources(boolean ghostly,level *lev)

{
  boolean bVar1;
  obj *poVar2;
  monst *pmVar3;
  ls_t *local_28;
  light_source *ls;
  uint nid;
  char which;
  level *lev_local;
  boolean ghostly_local;
  
  _nid = lev;
  lev_local._7_1_ = ghostly;
  for (local_28 = lev->lev_lights; local_28 != (ls_t *)0x0; local_28 = local_28->next) {
    if ((local_28->flags & 2U) != 0) {
      if ((local_28->type == 0) || (local_28->type == 1)) {
        if (lev_local._7_1_ == '\0') {
          ls._0_4_ = (uint)local_28->id;
        }
        else {
          bVar1 = lookup_id_mapping((uint)local_28->id,(uint *)&ls);
          if (bVar1 == '\0') {
            impossible("relink_light_sources: no id mapping");
          }
        }
        if (local_28->type == 0) {
          ls._7_1_ = 'o';
          poVar2 = find_oid(_nid,(uint)ls);
          local_28->id = poVar2;
        }
        else {
          ls._7_1_ = 'm';
          pmVar3 = find_mid(_nid,(uint)ls,7);
          local_28->id = pmVar3;
        }
        if (local_28->id == (void *)0x0) {
          impossible("relink_light_sources: cant find %c_id %d",(ulong)(uint)(int)ls._7_1_,
                     (ulong)(uint)ls);
        }
      }
      else {
        impossible("relink_light_sources: bad type (%d)",(ulong)(uint)(int)local_28->type);
      }
      local_28->flags = local_28->flags & 0xfffd;
    }
  }
  return;
}

Assistant:

void relink_light_sources(boolean ghostly, struct level *lev)
{
    char which;
    unsigned nid;
    light_source *ls;

    for (ls = lev->lev_lights; ls; ls = ls->next) {
	if (ls->flags & LSF_NEEDS_FIXUP) {
	    if (ls->type == LS_OBJECT || ls->type == LS_MONSTER) {
		if (ghostly) {
		    if (!lookup_id_mapping((long)ls->id, &nid))
			impossible("relink_light_sources: no id mapping");
		} else
		    nid = (long) ls->id;
		if (ls->type == LS_OBJECT) {
		    which = 'o';
		    ls->id = find_oid(lev, nid);
		} else {
		    which = 'm';
		    ls->id = find_mid(lev, nid, FM_EVERYWHERE);
		}
		if (!ls->id)
		    impossible("relink_light_sources: cant find %c_id %d",
			       which, nid);
	    } else
		impossible("relink_light_sources: bad type (%d)", ls->type);

	    ls->flags &= ~LSF_NEEDS_FIXUP;
	}
    }
}